

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O3

int BrotliEncoderCompressStream
              (BrotliEncoderState *s,BrotliEncoderOperation op,size_t *available_in,
              uint8_t **next_in,size_t *available_out,uint8_t **next_out,size_t *total_out)

{
  MemoryManager *pMVar1;
  anon_union_16_2_c961180f_for_tiny_buf_ *__dest;
  size_t *out_size;
  ulong uVar2;
  undefined8 uVar3;
  uint8_t uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  BrotliEncoderStreamState BVar8;
  ulong uVar9;
  ulong uVar10;
  uint32_t *puVar11;
  uint8_t *puVar12;
  long lVar13;
  uint8_t *puVar14;
  int *table;
  byte bVar15;
  bool bVar17;
  ushort uVar18;
  size_t __n;
  ulong uVar19;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  uint8_t *puVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint uVar26;
  bool bVar27;
  uint32_t *local_a0;
  uint32_t *local_90;
  uint8_t *local_88;
  uint8_t *local_80;
  size_t storage_ix;
  uint local_60;
  BrotliEncoderStreamState local_5c;
  uint8_t *local_58;
  size_t *local_50;
  uint16_t *local_48;
  uint8_t *local_40;
  size_t local_38;
  byte bVar16;
  
  if (s->is_initialized_ == 0) {
    s->last_bytes_ = 0;
    s->last_bytes_bits_ = '\0';
    s->flint_ = -2;
    s->remaining_metadata_bytes_ = 0xffffffff;
    uVar7 = (s->params).quality;
    uVar21 = 0;
    if (0 < (int)uVar7) {
      uVar21 = uVar7;
    }
    uVar26 = 0xb;
    if ((int)uVar21 < 0xb) {
      uVar26 = uVar21;
    }
    (s->params).quality = uVar26;
    if ((int)uVar7 < 3) {
      (s->params).large_window = 0;
    }
    uVar21 = (s->params).lgwin;
    uVar26 = 10;
    if ((int)uVar21 < 10) {
LAB_001064d9:
      uVar21 = uVar26;
      (s->params).lgwin = uVar21;
    }
    else {
      uVar26 = 0x1e;
      if ((s->params).large_window == 0) {
        uVar26 = 0x18;
      }
      if (uVar26 < uVar21) goto LAB_001064d9;
    }
    uVar26 = uVar21;
    if ((1 < (int)uVar7) && (uVar26 = 0xe, 3 < uVar7)) {
      uVar26 = (s->params).lgblock;
      if (uVar26 == 0) {
        uVar26 = 0x10;
        if (((8 < uVar7) && (0x10 < uVar21)) && (uVar26 = 0x12, uVar21 < 0x12)) {
          uVar26 = uVar21;
        }
      }
      else {
        uVar7 = 0x10;
        if (0x10 < (int)uVar26) {
          uVar7 = uVar26;
        }
        uVar26 = 0x18;
        if ((int)uVar7 < 0x18) {
          uVar26 = uVar7;
        }
      }
    }
    (s->params).lgblock = uVar26;
    ChooseDistanceParams(&s->params);
    uVar10 = (s->params).stream_offset;
    if (uVar10 != 0) {
      s->flint_ = '\x02';
      s->dist_cache_[0] = -0x10;
      s->dist_cache_[1] = -0x10;
      s->dist_cache_[2] = -0x10;
      s->dist_cache_[3] = -0x10;
      uVar3 = *(undefined8 *)(s->dist_cache_ + 2);
      *(undefined8 *)s->saved_dist_cache_ = *(undefined8 *)s->dist_cache_;
      *(undefined8 *)(s->saved_dist_cache_ + 2) = uVar3;
    }
    uVar7 = (s->params).lgwin;
    iVar6 = (s->params).lgblock;
    bVar15 = (byte)iVar6;
    bVar16 = bVar15;
    if (iVar6 < (int)uVar7) {
      bVar16 = (byte)uVar7;
    }
    uVar24 = 1 << (bVar16 + 1 & 0x1f);
    uVar21 = (s->params).quality;
    uVar25 = 1 << (bVar15 & 0x1f);
    uVar26 = 0x12;
    if (0x12 < (int)uVar7) {
      uVar26 = uVar7;
    }
    if (1 < uVar21) {
      uVar26 = uVar7;
    }
    (s->ringbuffer_).size_ = uVar24;
    (s->ringbuffer_).mask_ = uVar24 - 1;
    (s->ringbuffer_).tail_size_ = uVar25;
    (s->ringbuffer_).total_size_ = uVar24 + uVar25;
    if (uVar10 == 0) {
      if ((s->params).large_window == 0) {
        if (uVar26 == 0x10) {
          uVar4 = '\x01';
          uVar18 = 0;
        }
        else if (uVar26 == 0x11) {
          uVar4 = '\a';
          uVar18 = 1;
        }
        else if ((int)uVar26 < 0x12) {
          uVar18 = (short)uVar26 * 0x10 - 0x7f;
          uVar4 = '\a';
        }
        else {
          uVar18 = (short)uVar26 * 2 - 0x21;
          uVar4 = '\x04';
        }
      }
      else {
        uVar18 = (ushort)((uVar26 & 0x3f) << 8) | 0x11;
        uVar4 = '\x0e';
      }
      s->last_bytes_ = uVar18;
      s->last_bytes_bits_ = uVar4;
    }
    else {
      uVar9 = (1L << ((byte)uVar26 & 0x3f)) - 0x10;
      if (uVar10 < uVar9) {
        uVar9 = uVar10;
      }
      (s->params).stream_offset = uVar9;
    }
    if (uVar21 == 0) {
      memcpy(s->cmd_depths_,InitCommandPrefixCodes_kDefaultCommandDepths,0x80);
      memcpy(s->cmd_bits_,InitCommandPrefixCodes_kDefaultCommandBits,0x100);
      s->cmd_code_[0] = 0xff;
      s->cmd_code_[1] = 'w';
      s->cmd_code_[2] = 0xd5;
      s->cmd_code_[3] = 0xbf;
      s->cmd_code_[4] = 0xe7;
      s->cmd_code_[5] = 0xde;
      s->cmd_code_[6] = 0xea;
      s->cmd_code_[7] = 0x9e;
      s->cmd_code_[8] = 'Q';
      s->cmd_code_[9] = ']';
      s->cmd_code_[10] = 0xde;
      s->cmd_code_[0xb] = 0xc6;
      s->cmd_code_[0xc] = 'p';
      s->cmd_code_[0xd] = 'W';
      s->cmd_code_[0xe] = 0xbc;
      s->cmd_code_[0xf] = 'X';
      s->cmd_code_[0x10] = 'X';
      s->cmd_code_[0x11] = 'X';
      s->cmd_code_[0x12] = 0xd8;
      s->cmd_code_[0x13] = 0xd8;
      s->cmd_code_[0x14] = 'X';
      s->cmd_code_[0x15] = 0xd5;
      s->cmd_code_[0x16] = 0xcb;
      s->cmd_code_[0x17] = 0x8c;
      s->cmd_code_[0x18] = 0xea;
      s->cmd_code_[0x19] = 0xe0;
      s->cmd_code_[0x1a] = 0xc3;
      s->cmd_code_[0x1b] = 0x87;
      s->cmd_code_[0x1c] = '\x1f';
      s->cmd_code_[0x1d] = 0x83;
      s->cmd_code_[0x1e] = 0xc1;
      s->cmd_code_[0x1f] = '`';
      s->cmd_code_[0x20] = '\x1c';
      s->cmd_code_[0x21] = 'g';
      s->cmd_code_[0x22] = 0xb2;
      s->cmd_code_[0x23] = 0xaa;
      s->cmd_code_[0x24] = '\x06';
      s->cmd_code_[0x25] = 0x83;
      s->cmd_code_[0x26] = 0xc1;
      s->cmd_code_[0x27] = '`';
      s->cmd_code_[0x28] = '0';
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x29] = '\x18';
      s->cmd_code_[0x2a] = 0xcc;
      s->cmd_code_[0x2b] = 0xa1;
      s->cmd_code_[0x2c] = 0xce;
      s->cmd_code_[0x2d] = 0x88;
      s->cmd_code_[0x2e] = 'T';
      s->cmd_code_[0x2f] = 0x94;
      s->cmd_code_[0x30] = 'F';
      s->cmd_code_[0x31] = 0xe1;
      s->cmd_code_[0x32] = 0xb0;
      s->cmd_code_[0x33] = 0xd0;
      s->cmd_code_[0x34] = 'N';
      s->cmd_code_[0x35] = 0xb2;
      s->cmd_code_[0x36] = 0xf7;
      s->cmd_code_[0x37] = '\x04';
      s->cmd_code_[0x38] = '\0';
      s->cmd_code_numbits_ = 0x1c0;
    }
    s->is_initialized_ = 1;
  }
  if ((ulong)s->remaining_metadata_bytes_ != 0xffffffff) {
    if (op != BROTLI_OPERATION_EMIT_METADATA) {
      return 0;
    }
    if (*available_in != (ulong)s->remaining_metadata_bytes_) {
      return 0;
    }
LAB_001066c1:
    if ((s->params).size_hint == 0) {
      uVar10 = s->input_pos_ - s->last_processed_pos_;
      if (0x3fffffff < uVar10) {
        uVar10 = 0x40000000;
      }
      (s->params).size_hint = uVar10;
    }
    if (*available_in < 0x1000001) {
      if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
        s->remaining_metadata_bytes_ = (uint32_t)*available_in;
        s->stream_state_ = BROTLI_STREAM_METADATA_HEAD;
      }
      else if (1 < s->stream_state_ - BROTLI_STREAM_METADATA_HEAD) {
        return 0;
      }
      __dest = &s->tiny_buf_;
      do {
        while( true ) {
          do {
            iVar6 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
          } while (iVar6 != 0);
          if (s->available_out_ != 0) {
            return 1;
          }
          if (s->input_pos_ != s->last_flush_pos_) break;
          if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD) {
            s->next_out_ = (uint8_t *)__dest;
            uVar7 = s->remaining_metadata_bytes_;
            bVar16 = s->last_bytes_bits_;
            uVar22 = (ulong)bVar16;
            *(uint16_t *)&s->tiny_buf_ = s->last_bytes_;
            s->last_bytes_ = 0;
            s->last_bytes_bits_ = '\0';
            *(ulong *)((long)&s->tiny_buf_ + (ulong)(bVar16 >> 3)) =
                 (ulong)(s->tiny_buf_).u8[bVar16 >> 3];
            uVar9 = uVar22 + 1 >> 3;
            uVar19 = (ulong)(bVar16 + 3 >> 3);
            uVar10 = uVar22 + 4;
            *(ulong *)((long)&s->tiny_buf_ + uVar9) =
                 3L << ((byte)(uVar22 + 1) & 7) | (ulong)(s->tiny_buf_).u8[uVar9];
            *(ulong *)((long)&s->tiny_buf_ + uVar19) = (ulong)(s->tiny_buf_).u8[uVar19];
            if ((ulong)uVar7 == 1) {
              uVar21 = 0;
LAB_00106a3d:
              uVar9 = uVar22 + (ulong)uVar21 * 8;
              *(ulong *)((long)__dest + (uVar10 >> 3)) =
                   (ulong)uVar21 << ((byte)uVar10 & 7) | (ulong)__dest->u8[uVar10 >> 3];
              uVar10 = uVar22 + 6 >> 3;
              *(ulong *)((long)__dest + uVar10) =
                   (ulong)uVar7 - 1 << ((byte)(uVar22 + 6) & 7) | (ulong)__dest->u8[uVar10];
            }
            else {
              if (uVar7 != 0) {
                uVar21 = 0x1f;
                if (uVar7 - 1 != 0) {
                  for (; uVar7 - 1 >> uVar21 == 0; uVar21 = uVar21 - 1) {
                  }
                }
                uVar21 = (uVar21 ^ 0xffffffe0) + 0x28 >> 3;
                goto LAB_00106a3d;
              }
              *(ulong *)((long)__dest + (uVar10 >> 3)) = (ulong)__dest->u8[uVar10 >> 3];
              uVar9 = uVar22;
            }
            s->available_out_ = uVar9 + 0xd >> 3;
            s->stream_state_ = BROTLI_STREAM_METADATA_BODY;
          }
          else {
            uVar7 = s->remaining_metadata_bytes_;
            uVar10 = (ulong)uVar7;
            if (uVar10 == 0) {
              s->remaining_metadata_bytes_ = 0xffffffff;
              s->stream_state_ = BROTLI_STREAM_PROCESSING;
              return 1;
            }
            uVar9 = *available_out;
            if (uVar9 == 0) {
              if (0xf < uVar7) {
                uVar7 = 0x10;
              }
              uVar10 = (ulong)uVar7;
              s->next_out_ = (uint8_t *)__dest;
              memcpy(__dest,*next_in,uVar10);
              *next_in = *next_in + uVar10;
              *available_in = *available_in - uVar10;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - uVar7;
              s->available_out_ = uVar10;
            }
            else {
              if (uVar10 < uVar9) {
                uVar9 = uVar10;
              }
              memcpy(*next_out,*next_in,uVar9);
              *next_in = *next_in + uVar9;
              *available_in = *available_in - uVar9;
              s->remaining_metadata_bytes_ = s->remaining_metadata_bytes_ - (int)uVar9;
              *next_out = *next_out + uVar9;
              *available_out = *available_out - uVar9;
            }
          }
        }
        iVar6 = EncodeData(s,0,1,&s->available_out_,&s->next_out_);
      } while (iVar6 != 0);
    }
    return 0;
  }
  if (op == BROTLI_OPERATION_EMIT_METADATA) goto LAB_001066c1;
  if (s->stream_state_ - BROTLI_STREAM_METADATA_HEAD < 2) {
    return 0;
  }
  if ((s->stream_state_ != BROTLI_STREAM_PROCESSING) && (*available_in != 0)) {
    return 0;
  }
  uVar7 = (s->params).quality;
  if (1 < uVar7) {
    pMVar1 = &s->memory_manager_;
    out_size = &s->available_out_;
LAB_00106ae8:
    do {
      while( true ) {
        while( true ) {
          uVar9 = s->input_pos_ - s->last_processed_pos_;
          uVar22 = 1L << ((byte)(s->params).lgblock & 0x3f);
          uVar10 = uVar22 - uVar9;
          if (uVar22 < uVar9) {
            uVar10 = 0;
          }
          uVar22 = (ulong)s->flint_;
          uVar9 = uVar22;
          if (uVar10 < uVar22) {
            uVar9 = uVar10;
          }
          if ((long)uVar22 < 0) {
            uVar9 = uVar10;
          }
          if ((uVar9 == 0) || (uVar10 = *available_in, uVar10 == 0)) break;
          if (uVar9 < uVar10) {
            uVar10 = uVar9;
          }
          puVar14 = *next_in;
          uVar24 = (s->ringbuffer_).pos_;
          uVar7 = (uint)uVar10;
          if ((uVar24 == 0) && (uVar10 < (s->ringbuffer_).tail_size_)) {
            (s->ringbuffer_).pos_ = uVar7;
            puVar12 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar7 + 2) + 7);
            puVar23 = (s->ringbuffer_).data_;
            if (puVar23 != (uint8_t *)0x0) {
              memcpy(puVar12,puVar23,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
              BrotliFree(pMVar1,(s->ringbuffer_).data_);
            }
            (s->ringbuffer_).data_ = puVar12;
            (s->ringbuffer_).cur_size_ = uVar7;
            (s->ringbuffer_).buffer_ = puVar12 + 2;
            puVar12[1] = '\0';
            (s->ringbuffer_).buffer_[-2] = '\0';
            lVar13 = 0;
            do {
              (s->ringbuffer_).buffer_[lVar13 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
              lVar13 = lVar13 + 1;
            } while (lVar13 != 7);
            memcpy((s->ringbuffer_).buffer_,puVar14,uVar10);
            uVar7 = (s->ringbuffer_).pos_;
          }
          else {
            uVar21 = (s->ringbuffer_).total_size_;
            if ((s->ringbuffer_).cur_size_ < uVar21) {
              puVar12 = (uint8_t *)BrotliAllocate(pMVar1,(ulong)(uVar21 + 2) + 7);
              puVar23 = (s->ringbuffer_).data_;
              if (puVar23 != (uint8_t *)0x0) {
                memcpy(puVar12,puVar23,(ulong)((s->ringbuffer_).cur_size_ + 2) + 7);
                BrotliFree(pMVar1,(s->ringbuffer_).data_);
              }
              (s->ringbuffer_).data_ = puVar12;
              (s->ringbuffer_).cur_size_ = uVar21;
              (s->ringbuffer_).buffer_ = puVar12 + 2;
              puVar12[1] = '\0';
              (s->ringbuffer_).buffer_[-2] = '\0';
              lVar13 = 0;
              do {
                (s->ringbuffer_).buffer_[lVar13 + (ulong)(s->ringbuffer_).cur_size_] = '\0';
                lVar13 = lVar13 + 1;
              } while (lVar13 != 7);
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 2] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_ - 1] = '\0';
              (s->ringbuffer_).buffer_[(s->ringbuffer_).size_] = 0xf1;
              uVar24 = (s->ringbuffer_).pos_;
            }
            uVar26 = uVar24 & (s->ringbuffer_).mask_;
            uVar22 = (ulong)uVar26;
            uVar9 = (ulong)(s->ringbuffer_).size_;
            uVar21 = (s->ringbuffer_).tail_size_;
            if (uVar26 < uVar21) {
              uVar19 = uVar21 - uVar22;
              if (uVar10 < uVar19) {
                uVar19 = uVar10;
              }
              memcpy((s->ringbuffer_).buffer_ + uVar22 + uVar9,puVar14,uVar19);
              uVar9 = (ulong)(s->ringbuffer_).size_;
            }
            puVar23 = (s->ringbuffer_).buffer_ + uVar22;
            __n = uVar10;
            if (uVar9 < uVar22 + uVar10) {
              uVar9 = (s->ringbuffer_).total_size_ - uVar22;
              if (uVar10 < uVar9) {
                uVar9 = uVar10;
              }
              memcpy(puVar23,puVar14,uVar9);
              puVar23 = (s->ringbuffer_).buffer_;
              lVar13 = (s->ringbuffer_).size_ - uVar22;
              puVar14 = puVar14 + lVar13;
              __n = uVar10 - lVar13;
            }
            memcpy(puVar23,puVar14,__n);
            puVar14 = (s->ringbuffer_).buffer_;
            uVar21 = (s->ringbuffer_).pos_;
            puVar14[-2] = puVar14[(s->ringbuffer_).size_ - 2];
            puVar14 = (s->ringbuffer_).buffer_;
            puVar14[-1] = puVar14[(s->ringbuffer_).size_ - 1];
            uVar7 = (uVar7 & 0x7fffffff) + ((s->ringbuffer_).pos_ & 0x7fffffff) |
                    uVar21 & 0x80000000;
            (s->ringbuffer_).pos_ = uVar7;
          }
          s->input_pos_ = s->input_pos_ + uVar10;
          if (uVar7 <= (s->ringbuffer_).mask_) {
            puVar14 = (s->ringbuffer_).buffer_;
            puVar23 = puVar14 + (ulong)uVar7 + 3;
            puVar23[0] = '\0';
            puVar23[1] = '\0';
            puVar23[2] = '\0';
            puVar23[3] = '\0';
            puVar14 = puVar14 + uVar7;
            puVar14[0] = '\0';
            puVar14[1] = '\0';
            puVar14[2] = '\0';
            puVar14[3] = '\0';
          }
          *next_in = *next_in + uVar10;
          *available_in = *available_in - uVar10;
          if ('\0' < s->flint_) {
            s->flint_ = s->flint_ - (char)uVar10;
          }
        }
        iVar6 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
        if (iVar6 != 0) break;
        if (*out_size != 0) {
          return 1;
        }
        if (s->stream_state_ != BROTLI_STREAM_PROCESSING) {
          if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
            return 1;
          }
          goto LAB_00107367;
        }
        if ((op == BROTLI_OPERATION_PROCESS) && (uVar9 != 0)) {
          return 1;
        }
        uVar10 = *available_in;
        bVar27 = uVar10 == 0;
        bVar17 = op == BROTLI_OPERATION_FINISH && bVar27;
        bVar5 = op == BROTLI_OPERATION_FLUSH && bVar27;
        if ((op != BROTLI_OPERATION_FINISH || !bVar27) && (s->flint_ == '\0')) {
          s->flint_ = -1;
          bVar5 = true;
        }
        if ((s->params).size_hint == 0) {
          uVar9 = s->input_pos_ - s->last_processed_pos_;
          uVar22 = uVar9 + uVar10;
          if (0x3fffffff < uVar22) {
            uVar22 = 0x40000000;
          }
          if (0x3fffffff < (uVar9 | uVar10)) {
            uVar22 = 0x40000000;
          }
          (s->params).size_hint = uVar22;
        }
        iVar6 = EncodeData(s,(uint)bVar17,(uint)bVar5,out_size,&s->next_out_);
        if (iVar6 == 0) {
          return 0;
        }
        if ((bVar5 | bVar17) == 1) {
          s->stream_state_ = bVar17 + BROTLI_STREAM_FLUSH_REQUESTED;
        }
      }
    } while (s->flint_ != -1);
    if (s->stream_state_ != BROTLI_STREAM_PROCESSING) {
      if ((s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) || (*out_size != 0))
      goto LAB_00106ae8;
      s->stream_state_ = BROTLI_STREAM_PROCESSING;
      s->next_out_ = (uint8_t *)0x0;
    }
    s->flint_ = -2;
    goto LAB_00106ae8;
  }
  uVar22 = 1L << ((byte)(s->params).lgwin & 0x3f);
  uVar10 = *available_in;
  uVar9 = uVar22;
  if (uVar10 < uVar22) {
    uVar9 = uVar10;
  }
  sVar20 = 0x20000;
  if (uVar9 < 0x20000) {
    sVar20 = uVar9;
  }
  pMVar1 = &s->memory_manager_;
  if (uVar7 != 1) {
    local_80 = (uint8_t *)0x0;
    local_88 = (uint8_t *)0x0;
    local_a0 = (uint32_t *)0x0;
    local_90 = (uint32_t *)0x0;
    goto LAB_001070ae;
  }
  local_a0 = s->command_buf_;
  if ((local_a0 == (uint32_t *)0x0) && (0x1ffff < uVar9)) {
    puVar11 = (uint32_t *)BrotliAllocate(pMVar1,0x80000);
    s->command_buf_ = puVar11;
    local_80 = (uint8_t *)BrotliAllocate(pMVar1,0x20000);
    s->literal_buf_ = local_80;
    local_a0 = s->command_buf_;
    if (local_a0 != (uint32_t *)0x0) {
LAB_00106810:
      local_88 = (uint8_t *)0x0;
      local_90 = (uint32_t *)0x0;
      goto LAB_001070ae;
    }
  }
  else {
    if (local_a0 != (uint32_t *)0x0) {
      local_80 = s->literal_buf_;
      local_88 = (uint8_t *)0x0;
      local_90 = (uint32_t *)0x0;
      goto LAB_001070ae;
    }
    if (uVar10 == 0) {
      local_80 = (uint8_t *)0x0;
      local_a0 = (uint32_t *)0x0;
      goto LAB_00106810;
    }
  }
  local_a0 = (uint32_t *)BrotliAllocate(pMVar1,sVar20 * 4);
  local_88 = (uint8_t *)BrotliAllocate(pMVar1,sVar20);
  local_90 = local_a0;
  local_80 = local_88;
LAB_001070ae:
  local_40 = s->cmd_depths_;
  local_48 = s->cmd_bits_;
  local_50 = &s->cmd_code_numbits_;
  local_58 = s->cmd_code_;
  local_60 = op - BROTLI_OPERATION_FLUSH;
  local_5c = (op == BROTLI_OPERATION_FINISH) + BROTLI_STREAM_FLUSH_REQUESTED;
LAB_00107103:
  do {
    iVar6 = InjectFlushOrPushOutput(s,available_out,next_out,total_out);
  } while (iVar6 != 0);
  if (((s->available_out_ != 0) || (s->stream_state_ != BROTLI_STREAM_PROCESSING)) ||
     (uVar10 = *available_in, op == BROTLI_OPERATION_PROCESS && uVar10 == 0)) {
    BrotliFree(pMVar1,local_90);
    BrotliFree(pMVar1,local_88);
    if (s->stream_state_ != BROTLI_STREAM_FLUSH_REQUESTED) {
      return 1;
    }
    if (s->available_out_ != 0) {
      return 1;
    }
LAB_00107367:
    s->stream_state_ = BROTLI_STREAM_PROCESSING;
    s->next_out_ = (uint8_t *)0x0;
    return 1;
  }
  uVar9 = uVar10;
  if (uVar10 > uVar22) {
    uVar9 = uVar22;
  }
  storage_ix = (size_t)s->last_bytes_bits_;
  BVar8 = BROTLI_STREAM_FLUSH_REQUESTED;
  if (op != BROTLI_OPERATION_FLUSH || uVar10 != 0) goto code_r0x00107192;
  goto LAB_00107312;
code_r0x00107192:
  uVar19 = uVar9 * 2 + 0x1f7;
  uVar2 = *available_out;
  if (uVar2 < uVar19) {
    puVar14 = GetBrotliStorage(s,uVar19);
  }
  else {
    puVar14 = *next_out;
  }
  uVar7 = (uint)(op == BROTLI_OPERATION_FINISH && uVar10 <= uVar22);
  *puVar14 = (uint8_t)s->last_bytes_;
  puVar14[1] = *(uint8_t *)((long)&s->last_bytes_ + 1);
  table = GetHashTable(s,(s->params).quality,uVar9,&local_38);
  if ((s->params).quality == 0) {
    BrotliCompressFragmentFast
              (pMVar1,*next_in,uVar9,uVar7,table,local_38,local_40,local_48,local_50,local_58,
               &storage_ix,puVar14);
  }
  else {
    BrotliCompressFragmentTwoPass
              (pMVar1,*next_in,uVar9,uVar7,local_a0,local_80,table,local_38,&storage_ix,puVar14);
  }
  if (uVar10 != 0) {
    *next_in = *next_in + uVar9;
    *available_in = *available_in - uVar9;
  }
  uVar9 = storage_ix >> 3;
  if (uVar2 < uVar19) {
    s->next_out_ = puVar14;
    s->available_out_ = uVar9;
  }
  else {
    *next_out = *next_out + uVar9;
    *available_out = *available_out - uVar9;
    sVar20 = s->total_out_ + uVar9;
    s->total_out_ = sVar20;
    if (total_out != (size_t *)0x0) {
      *total_out = sVar20;
    }
  }
  s->last_bytes_ = (ushort)puVar14[uVar9];
  s->last_bytes_bits_ = (byte)storage_ix & 7;
  BVar8 = local_5c;
  if (local_60 < 2 && uVar10 <= uVar22) {
LAB_00107312:
    s->stream_state_ = BVar8;
  }
  goto LAB_00107103;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompressStream(
    BrotliEncoderState* s, BrotliEncoderOperation op, size_t* available_in,
    const uint8_t** next_in, size_t* available_out,uint8_t** next_out,
    size_t* total_out) {
  if (!EnsureInitialized(s)) return BROTLI_FALSE;

  /* Unfinished metadata block; check requirements. */
  if (s->remaining_metadata_bytes_ != BROTLI_UINT32_MAX) {
    if (*available_in != s->remaining_metadata_bytes_) return BROTLI_FALSE;
    if (op != BROTLI_OPERATION_EMIT_METADATA) return BROTLI_FALSE;
  }

  if (op == BROTLI_OPERATION_EMIT_METADATA) {
    UpdateSizeHint(s, 0);  /* First data metablock might be emitted here. */
    return ProcessMetadata(
        s, available_in, next_in, available_out, next_out, total_out);
  }

  if (s->stream_state_ == BROTLI_STREAM_METADATA_HEAD ||
      s->stream_state_ == BROTLI_STREAM_METADATA_BODY) {
    return BROTLI_FALSE;
  }

  if (s->stream_state_ != BROTLI_STREAM_PROCESSING && *available_in != 0) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    return BrotliEncoderCompressStreamFast(s, op, available_in, next_in,
        available_out, next_out, total_out);
  }
  while (BROTLI_TRUE) {
    size_t remaining_block_size = RemainingInputBlockSize(s);
    /* Shorten input to flint size. */
    if (s->flint_ >= 0 && remaining_block_size > (size_t)s->flint_) {
      remaining_block_size = (size_t)s->flint_;
    }

    if (remaining_block_size != 0 && *available_in != 0) {
      size_t copy_input_size =
          BROTLI_MIN(size_t, remaining_block_size, *available_in);
      CopyInputToRingBuffer(s, copy_input_size, *next_in);
      *next_in += copy_input_size;
      *available_in -= copy_input_size;
      if (s->flint_ > 0) s->flint_ = (int8_t)(s->flint_ - (int)copy_input_size);
      continue;
    }

    if (InjectFlushOrPushOutput(s, available_out, next_out, total_out)) {
      /* Exit the "emit flint" workflow. */
      if (s->flint_ == BROTLI_FLINT_WAITING_FOR_FLUSHING) {
        CheckFlushComplete(s);
        if (s->stream_state_ == BROTLI_STREAM_PROCESSING) {
          s->flint_ = BROTLI_FLINT_DONE;
        }
      }
      continue;
    }

    /* Compress data only when internal output buffer is empty, stream is not
       finished and there is no pending flush request. */
    if (s->available_out_ == 0 &&
        s->stream_state_ == BROTLI_STREAM_PROCESSING) {
      if (remaining_block_size == 0 || op != BROTLI_OPERATION_PROCESS) {
        BROTLI_BOOL is_last = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FINISH);
        BROTLI_BOOL force_flush = TO_BROTLI_BOOL(
            (*available_in == 0) && op == BROTLI_OPERATION_FLUSH);
        BROTLI_BOOL result;
        /* Force emitting (uncompressed) piece containing flint. */
        if (!is_last && s->flint_ == 0) {
          s->flint_ = BROTLI_FLINT_WAITING_FOR_FLUSHING;
          force_flush = BROTLI_TRUE;
        }
        UpdateSizeHint(s, *available_in);
        result = EncodeData(s, is_last, force_flush,
            &s->available_out_, &s->next_out_);
        if (!result) return BROTLI_FALSE;
        if (force_flush) s->stream_state_ = BROTLI_STREAM_FLUSH_REQUESTED;
        if (is_last) s->stream_state_ = BROTLI_STREAM_FINISHED;
        continue;
      }
    }
    break;
  }
  CheckFlushComplete(s);
  return BROTLI_TRUE;
}